

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

int InitPassStats(VP8Encoder *enc,PassStats *s)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  undefined4 *in_RSI;
  long *in_RDI;
  float fVar4;
  undefined1 auVar5 [16];
  float target_PSNR;
  int do_size_search;
  uint64_t target_size;
  double local_30;
  double local_28;
  
  iVar2 = *(int *)(*in_RDI + 0x10);
  uVar3 = (uint)((long)iVar2 != 0);
  fVar1 = *(float *)(*in_RDI + 0x14);
  *in_RSI = 1;
  in_RSI[1] = 0x41200000;
  in_RSI[4] = (float)*(int *)(*in_RDI + 0x6c) * 1.0;
  in_RSI[5] = (float)*(int *)(*in_RDI + 0x70) * 1.0;
  fVar4 = Clamp(*(float *)(*in_RDI + 4),(float)in_RSI[4],(float)in_RSI[5]);
  in_RSI[3] = fVar4;
  in_RSI[2] = fVar4;
  if (uVar3 == 0) {
    if (fVar1 <= 0.0) {
      local_30 = 40.0;
    }
    else {
      local_30 = (double)fVar1;
    }
    local_28 = local_30;
  }
  else {
    auVar5._8_4_ = iVar2 >> 0x1f;
    auVar5._0_8_ = (long)iVar2;
    auVar5._12_4_ = 0x45300000;
    local_28 = (auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0);
  }
  *(double *)(in_RSI + 10) = local_28;
  *(undefined8 *)(in_RSI + 8) = 0;
  *(undefined8 *)(in_RSI + 6) = 0;
  in_RSI[0xc] = uVar3;
  return uVar3;
}

Assistant:

static int InitPassStats(const VP8Encoder* const enc, PassStats* const s) {
  const uint64_t target_size = (uint64_t)enc->config_->target_size;
  const int do_size_search = (target_size != 0);
  const float target_PSNR = enc->config_->target_PSNR;

  s->is_first = 1;
  s->dq = 10.f;
  s->qmin = 1.f * enc->config_->qmin;
  s->qmax = 1.f * enc->config_->qmax;
  s->q = s->last_q = Clamp(enc->config_->quality, s->qmin, s->qmax);
  s->target = do_size_search ? (double)target_size
            : (target_PSNR > 0.) ? target_PSNR
            : 40.;   // default, just in case
  s->value = s->last_value = 0.;
  s->do_size_search = do_size_search;
  return do_size_search;
}